

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

bool __thiscall
cmsys::SystemInformationImplementation::QueryProcessorBySysconf
          (SystemInformationImplementation *this)

{
  long lVar1;
  long c;
  SystemInformationImplementation *this_local;
  
  lVar1 = sysconf(0x54);
  if (0 < lVar1) {
    this->NumberOfPhysicalCPU = (uint)lVar1;
    this->NumberOfLogicalCPU = this->NumberOfPhysicalCPU;
  }
  return 0 < lVar1;
}

Assistant:

bool SystemInformationImplementation::QueryProcessorBySysconf()
{
#if defined(_SC_NPROC_ONLN) && !defined(_SC_NPROCESSORS_ONLN)
// IRIX names this slightly different
#define _SC_NPROCESSORS_ONLN _SC_NPROC_ONLN
#endif

#ifdef _SC_NPROCESSORS_ONLN
  long c = sysconf(_SC_NPROCESSORS_ONLN);
  if (c <= 0) {
    return false;
  }

  this->NumberOfPhysicalCPU = static_cast<unsigned int>(c);
  this->NumberOfLogicalCPU = this->NumberOfPhysicalCPU;

  return true;
#else
  return false;
#endif
}